

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash.cpp
# Opt level: O0

ResBytes * multihash::encode(ResBytes *__return_storage_ptr__,string *digest,UInt code)

{
  Bytes *in_R8;
  undefined1 local_88 [8];
  OptError err;
  undefined1 local_50 [8];
  Bytes dig;
  Bytes out;
  UInt code_local;
  string *digest_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &dig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  binary::decodeHex((Bytes *)local_50,digest);
  encode_abi_cxx11_((OptError *)local_88,(multihash *)local_50,(Bytes *)(ulong)code,(int)&dig + 0x10
                    ,in_R8);
  std::
  tuple<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::
  tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_true>
            (__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &dig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_88);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_88);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &dig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

ResBytes encode(std::string digest, UInt code) {
	Bytes out;
	Bytes dig = binary::decodeHex(digest);
	auto err = encode(dig, code, out);
	return {out, err};
}